

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

OnCallSpec<test_result_(unsigned_long_long)> * __thiscall
testing::internal::OnCallSpec<test_result_(unsigned_long_long)>::WillByDefault
          (OnCallSpec<test_result_(unsigned_long_long)> *this,
          Action<test_result_(unsigned_long_long)> *action)

{
  bool bVar1;
  undefined1 property;
  OnCallSpec<test_result_(unsigned_long_long)> *in_RDI;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  UntypedOnCallSpecBase *in_stack_ffffffffffffff70;
  UntypedOnCallSpecBase *this_00;
  undefined1 local_69 [56];
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,".WillByDefault() must appear exactly once in an ON_CALL().",&local_31);
  UntypedOnCallSpecBase::ExpectSpecProperty
            (in_stack_ffffffffffffff70,(bool)in_stack_ffffffffffffff6f,(string *)0x155831);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  (in_RDI->super_UntypedOnCallSpecBase).last_clause_ = kWillByDefault;
  bVar1 = Action<test_result_(unsigned_long_long)>::IsDoDefault
                    ((Action<test_result_(unsigned_long_long)> *)0x155860);
  property = !bVar1;
  this_00 = (UntypedOnCallSpecBase *)local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_69 + 1),"DoDefault() cannot be used in ON_CALL().",
             (allocator *)this_00);
  UntypedOnCallSpecBase::ExpectSpecProperty(this_00,(bool)property,(string *)0x1558a6);
  std::__cxx11::string::~string((string *)(local_69 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  Action<test_result_(unsigned_long_long)>::operator=
            ((Action<test_result_(unsigned_long_long)> *)this_00,
             (Action<test_result_(unsigned_long_long)> *)
             CONCAT17(property,in_stack_ffffffffffffff68));
  return in_RDI;
}

Assistant:

OnCallSpec& WillByDefault(const Action<F>& action) {
    ExpectSpecProperty(last_clause_ < kWillByDefault,
                       ".WillByDefault() must appear "
                       "exactly once in an ON_CALL().");
    last_clause_ = kWillByDefault;

    ExpectSpecProperty(!action.IsDoDefault(),
                       "DoDefault() cannot be used in ON_CALL().");
    action_ = action;
    return *this;
  }